

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<long_long> __thiscall
kj::anon_unknown_55::tryParseInteger<long_long>(anon_unknown_55 *this,StringPtr *s)

{
  longlong min_00;
  longlong max_00;
  Maybe<long_long> MVar1;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  min_00 = MinValue_::operator_cast_to_long_long((MinValue_ *)&minValue);
  max_00 = MaxValue_::operator_cast_to_long_long((MaxValue_ *)&maxValue);
  MVar1 = tryParseSigned(this,s,min_00,max_00);
  MVar1.ptr._0_8_ = this;
  return (Maybe<long_long>)MVar1.ptr;
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}